

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_curves.cpp
# Opt level: O1

void __thiscall
agg::curve3_div::recursive_bezier
          (curve3_div *this,double x1,double y1,double x2,double y2,double x3,double y3,uint level)

{
  long lVar1;
  ulong uVar2;
  uint uVar3;
  double dVar4;
  double dVar5;
  double x3_00;
  double y3_00;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double x2_00;
  double dVar10;
  double y2_00;
  
  do {
    if (0x20 < level) {
      return;
    }
    x2_00 = (x1 + x2) * 0.5;
    y2_00 = (y1 + y2) * 0.5;
    dVar9 = (x2 + x3) * 0.5;
    dVar10 = (y2 + y3) * 0.5;
    x3_00 = (x2_00 + dVar9) * 0.5;
    y3_00 = (y2_00 + dVar10) * 0.5;
    dVar4 = x3 - x1;
    dVar5 = y3 - y1;
    dVar7 = (x2 - x3) * dVar5 - (y2 - y3) * dVar4;
    if (ABS(dVar7) <= 1e-30) {
      dVar7 = dVar4 * dVar4 + dVar5 * dVar5;
      dVar8 = x2 - x1;
      dVar6 = y2 - y1;
      if ((dVar7 != 0.0) || (NAN(dVar7))) {
        dVar7 = (dVar8 * dVar4 + dVar6 * dVar5) / dVar7;
        if ((0.0 < dVar7) && (dVar7 < 1.0)) {
          return;
        }
        dVar8 = y1;
        dVar6 = x1;
        if ((dVar7 <= 0.0) || (dVar8 = y3, dVar6 = x3, 1.0 <= dVar7)) {
          dVar4 = (dVar6 - x2) * (dVar6 - x2) + (dVar8 - y2) * (dVar8 - y2);
        }
        else {
          dVar4 = (dVar4 * dVar7 + x1) - x2;
          dVar5 = (dVar5 * dVar7 + y1) - y2;
          dVar4 = dVar4 * dVar4 + dVar5 * dVar5;
        }
      }
      else {
        dVar4 = dVar8 * dVar8 + dVar6 * dVar6;
      }
      if (dVar4 < *(double *)(this + 8)) {
        uVar3 = *(uint *)(this + 0x20) >> 6;
        if (*(uint *)(this + 0x24) <= uVar3) {
          pod_bvector<agg::point_base<double>,_6U>::allocate_block
                    ((pod_bvector<agg::point_base<double>,_6U> *)(this + 0x20),uVar3);
        }
        lVar1 = *(long *)(*(long *)(this + 0x30) + (ulong)uVar3 * 8);
        uVar3 = *(uint *)(this + 0x20);
        uVar2 = (ulong)((uVar3 & 0x3f) << 4);
        *(double *)(lVar1 + uVar2) = x2;
        *(double *)(lVar1 + 8 + uVar2) = y2;
        goto LAB_00113a6c;
      }
    }
    else if (dVar7 * dVar7 <= (dVar4 * dVar4 + dVar5 * dVar5) * *(double *)(this + 8)) {
      if (0.01 < *(double *)(this + 0x10) || *(double *)(this + 0x10) == 0.01) {
        dVar4 = atan2(y3 - y2,x3 - x2);
        dVar5 = atan2(y2 - y1,x2 - x1);
        dVar4 = ABS(dVar4 - dVar5);
        if (*(double *)(this + 0x10) <=
            (double)(~-(ulong)(dVar4 < 3.141592653589793) & (ulong)(6.283185307179586 - dVar4) |
                    (ulong)dVar4 & -(ulong)(dVar4 < 3.141592653589793))) goto LAB_00113997;
      }
      uVar3 = *(uint *)(this + 0x20) >> 6;
      if (*(uint *)(this + 0x24) <= uVar3) {
        pod_bvector<agg::point_base<double>,_6U>::allocate_block
                  ((pod_bvector<agg::point_base<double>,_6U> *)(this + 0x20),uVar3);
      }
      lVar1 = *(long *)(*(long *)(this + 0x30) + (ulong)uVar3 * 8);
      uVar3 = *(uint *)(this + 0x20);
      uVar2 = (ulong)((uVar3 & 0x3f) << 4);
      *(double *)(lVar1 + uVar2) = x3_00;
      *(double *)(lVar1 + 8 + uVar2) = y3_00;
LAB_00113a6c:
      *(uint *)(this + 0x20) = uVar3 + 1;
      return;
    }
LAB_00113997:
    level = level + 1;
    recursive_bezier(this,x1,y1,x2_00,y2_00,x3_00,y3_00,level);
    x2 = dVar9;
    y1 = y3_00;
    x1 = x3_00;
    y2 = dVar10;
  } while( true );
}

Assistant:

void curve3_div::recursive_bezier(double x1, double y1, 
                                      double x2, double y2, 
                                      double x3, double y3,
                                      unsigned level)
    {
        if(level > curve_recursion_limit) 
        {
            return;
        }

        // Calculate all the mid-points of the line segments
        //----------------------
        double x12   = (x1 + x2) / 2;                
        double y12   = (y1 + y2) / 2;
        double x23   = (x2 + x3) / 2;
        double y23   = (y2 + y3) / 2;
        double x123  = (x12 + x23) / 2;
        double y123  = (y12 + y23) / 2;

        double dx = x3-x1;
        double dy = y3-y1;
        double d = fabs(((x2 - x3) * dy - (y2 - y3) * dx));
        double da;

        if(d > curve_collinearity_epsilon)
        { 
            // Regular case
            //-----------------
            if(d * d <= m_distance_tolerance_square * (dx*dx + dy*dy))
            {
                // If the curvature doesn't exceed the distance_tolerance value
                // we tend to finish subdivisions.
                //----------------------
                if(m_angle_tolerance < curve_angle_tolerance_epsilon)
                {
                    m_points.add(point_d(x123, y123));
                    return;
                }

                // Angle & Cusp Condition
                //----------------------
                da = fabs(atan2(y3 - y2, x3 - x2) - atan2(y2 - y1, x2 - x1));
                if(da >= pi) da = 2*pi - da;

                if(da < m_angle_tolerance)
                {
                    // Finally we can stop the recursion
                    //----------------------
                    m_points.add(point_d(x123, y123));
                    return;                 
                }
            }
        }
        else
        {
            // Collinear case
            //------------------
            da = dx*dx + dy*dy;
            if(da == 0)
            {
                d = calc_sq_distance(x1, y1, x2, y2);
            }
            else
            {
                d = ((x2 - x1)*dx + (y2 - y1)*dy) / da;
                if(d > 0 && d < 1)
                {
                    // Simple collinear case, 1---2---3
                    // We can leave just two endpoints
                    return;
                }
                     if(d <= 0) d = calc_sq_distance(x2, y2, x1, y1);
                else if(d >= 1) d = calc_sq_distance(x2, y2, x3, y3);
                else            d = calc_sq_distance(x2, y2, x1 + d*dx, y1 + d*dy);
            }
            if(d < m_distance_tolerance_square)
            {
                m_points.add(point_d(x2, y2));
                return;
            }
        }

        // Continue subdivision
        //----------------------
        recursive_bezier(x1, y1, x12, y12, x123, y123, level + 1); 
        recursive_bezier(x123, y123, x23, y23, x3, y3, level + 1); 
    }